

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

void nghttp2_bufs_free(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_buf_chain *next_chain;
  nghttp2_buf_chain *chain;
  nghttp2_bufs *bufs_local;
  
  if (bufs != (nghttp2_bufs *)0x0) {
    next_chain = bufs->head;
    while (next_chain != (nghttp2_buf_chain *)0x0) {
      pnVar1 = next_chain->next;
      buf_chain_del(next_chain,bufs->mem);
      next_chain = pnVar1;
    }
    bufs->head = (nghttp2_buf_chain *)0x0;
  }
  return;
}

Assistant:

void nghttp2_bufs_free(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *next_chain;

  if (bufs == NULL) {
    return;
  }

  for (chain = bufs->head; chain;) {
    next_chain = chain->next;

    buf_chain_del(chain, bufs->mem);

    chain = next_chain;
  }

  bufs->head = NULL;
}